

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O3

gboolean timerSourcePrepareHelper(GTimerSource *src,gint *timeout)

{
  uint uVar1;
  long lVar2;
  gint gVar3;
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> _Var4;
  long lVar6;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar7;
  long lVar5;
  
  if (((src->processEventsFlags).super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
       super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) == 0) {
    oVar7 = QTimerInfoList::timerWait(&src->timerList);
    _Var4 = (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)
            0xfffffffffff0bdc0;
    if (((undefined1  [16])
         oVar7.
         super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> &
        (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      _Var4 = oVar7.
              super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ._M_payload;
    }
    lVar6 = (ulong)(((long)_Var4 / 1000000) * 1000000 < (long)_Var4) + (long)_Var4 / 1000000;
    lVar2 = 0x7fffffff;
    if (lVar6 < 0x7fffffff) {
      lVar2 = lVar6;
    }
    lVar5 = -0x80000000;
    if (-0x80000000 < lVar2) {
      lVar5 = lVar2;
    }
    gVar3 = (gint)lVar5;
    uVar1 = (uint)(lVar6 == 0);
  }
  else {
    uVar1 = 1;
    gVar3 = -1;
  }
  *timeout = gVar3;
  return uVar1;
}

Assistant:

static gboolean timerSourcePrepareHelper(GTimerSource *src, gint *timeout)
{
    if (src->processEventsFlags & QEventLoop::X11ExcludeTimers) {
        *timeout = -1;
        return true;
    }

    auto remaining = src->timerList.timerWait().value_or(-1ms);
    *timeout = q26::saturate_cast<gint>(ceil<milliseconds>(remaining).count());

    return (*timeout == 0);
}